

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::EncodeSymbol
          (MeshEdgebreakerTraversalPredictiveEncoder *this,EdgebreakerTopologyBitPattern symbol)

{
  uint uVar1;
  CornerTable *pCVar2;
  pointer piVar3;
  iterator __position;
  ulong uVar4;
  int32_t *piVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  EdgebreakerTopologyBitPattern local_14;
  
  this->num_symbols_ = this->num_symbols_ + 1;
  uVar1 = (this->last_corner_).value_;
  uVar11 = (ulong)uVar1;
  uVar8 = uVar1;
  if (uVar11 != 0xffffffff) {
    uVar8 = uVar1 - 2;
    if (0x55555555 < (uVar1 + 1) * -0x55555555) {
      uVar8 = uVar1 + 1;
    }
  }
  uVar6 = uVar1;
  if (uVar1 != 0xffffffff) {
    uVar6 = ((uVar1 * -0x55555555 < 0x55555556) - 1 | 2) + uVar1;
  }
  iVar9 = -1;
  uVar4 = 0xffffffff;
  switch(symbol) {
  case TOPOLOGY_C:
    break;
  case TOPOLOGY_S:
    goto switchD_0013f810_caseD_1;
  default:
    goto switchD_0013f810_caseD_2;
  case TOPOLOGY_L:
    pCVar2 = this->corner_table_;
    uVar10 = 0xffffffff;
    if (uVar1 != 0xffffffff) {
      uVar10 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar11].value_;
    }
    piVar3 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3[uVar10] = piVar3[uVar10] + -1;
    uVar11 = 0xffffffff;
    if (uVar8 != 0xffffffff) {
      uVar11 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
    }
    piVar3[uVar11] = piVar3[uVar11] + -2;
    if (uVar6 != 0xffffffff) {
      uVar4 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
    }
    piVar5 = piVar3 + uVar4;
    iVar7 = -1;
    iVar9 = -1;
    goto LAB_0013f9f6;
  case TOPOLOGY_R:
    pCVar2 = this->corner_table_;
    uVar10 = 0xffffffff;
    if (uVar8 != 0xffffffff) {
      uVar10 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
    }
    piVar3 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = 9;
    if (-1 < piVar3[uVar10]) {
      iVar9 = (uint)(piVar3[uVar10] < 6) * 5;
    }
    uVar10 = 0xffffffff;
    if (uVar1 != 0xffffffff) {
      uVar10 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar11].value_;
    }
    piVar3[uVar10] = piVar3[uVar10] + -1;
    uVar11 = 0xffffffff;
    if (uVar8 != 0xffffffff) {
      uVar11 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
    }
    piVar3[uVar11] = piVar3[uVar11] + -1;
    if (uVar6 != 0xffffffff) {
      uVar4 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
    }
    piVar5 = piVar3 + uVar4;
    goto LAB_0013f9f1;
  case TOPOLOGY_E:
    pCVar2 = this->corner_table_;
    uVar10 = 0xffffffff;
    if (uVar1 != 0xffffffff) {
      uVar10 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar11].value_;
    }
    piVar3 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3[uVar10] = piVar3[uVar10] + -2;
    uVar11 = 0xffffffff;
    if (uVar8 != 0xffffffff) {
      uVar11 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
    }
    piVar3[uVar11] = piVar3[uVar11] + -2;
    if (uVar6 != 0xffffffff) {
      uVar4 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
    }
    piVar5 = piVar3 + uVar4;
    iVar9 = -1;
LAB_0013f9f1:
    iVar7 = -2;
    goto LAB_0013f9f6;
  }
  uVar11 = 0xffffffff;
  if (uVar8 != 0xffffffff) {
    uVar11 = (ulong)(this->corner_table_->corner_to_vertex_map_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
  }
  iVar7 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11];
  iVar9 = 9;
  if (-1 < iVar7) {
    iVar9 = (uint)(iVar7 < 6) * 5;
  }
switchD_0013f810_caseD_1:
  pCVar2 = this->corner_table_;
  uVar11 = 0xffffffff;
  if (uVar8 != 0xffffffff) {
    uVar11 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
  }
  piVar3 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3[uVar11] = piVar3[uVar11] + -1;
  uVar11 = 0xffffffff;
  if (uVar6 != 0xffffffff) {
    uVar11 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
  }
  piVar3[uVar11] = piVar3[uVar11] + -1;
  if (symbol == TOPOLOGY_S) {
    uVar11 = (ulong)(this->last_corner_).value_;
    if (uVar11 != 0xffffffff) {
      uVar4 = (ulong)(pCVar2->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11].value_;
    }
    piVar3[uVar4] = -1;
    piVar5 = &this->num_split_symbols_;
    iVar7 = 1;
LAB_0013f9f6:
    *piVar5 = *piVar5 + iVar7;
  }
switchD_0013f810_caseD_2:
  if (iVar9 != -1) {
    if (iVar9 == this->prev_symbol_) {
      std::vector<bool,_std::allocator<bool>_>::push_back(&this->predictions_,true);
      goto LAB_0013fa65;
    }
    if (this->prev_symbol_ != -1) {
      std::vector<bool,_std::allocator<bool>_>::push_back(&this->predictions_,false);
    }
  }
  if (this->prev_symbol_ != ~TOPOLOGY_C) {
    __position._M_current =
         (this->super_MeshEdgebreakerTraversalEncoder).symbols_.
         super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->super_MeshEdgebreakerTraversalEncoder).symbols_.
        super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
      ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                ((vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                  *)&(this->super_MeshEdgebreakerTraversalEncoder).symbols_,__position,&local_14);
    }
    else {
      *__position._M_current = this->prev_symbol_;
      (this->super_MeshEdgebreakerTraversalEncoder).symbols_.
      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
LAB_0013fa65:
  this->prev_symbol_ = symbol;
  return;
}

Assistant:

inline void EncodeSymbol(EdgebreakerTopologyBitPattern symbol) {
    ++num_symbols_;
    // Update valences on the mesh. And compute the predicted preceding symbol.
    // Note that the valences are computed for the so far unencoded part of the
    // mesh. Adding a new symbol either reduces valences on the vertices or
    // leaves the valence unchanged.
    int32_t predicted_symbol = -1;
    const CornerIndex next = corner_table_->Next(last_corner_);
    const CornerIndex prev = corner_table_->Previous(last_corner_);
    switch (symbol) {
      case TOPOLOGY_C:
        // Compute prediction.
        predicted_symbol = ComputePredictedSymbol(corner_table_->Vertex(next));
        FALLTHROUGH_INTENDED;
      case TOPOLOGY_S:
        // Update valences.
        vertex_valences_[corner_table_->Vertex(next).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 1;
        if (symbol == TOPOLOGY_S) {
          // Whenever we reach a split symbol, mark its tip vertex as invalid by
          // setting the valence to a negative value. Any prediction that will
          // use this vertex will then cause a misprediction. This is currently
          // necessary because the decoding works in the reverse direction and
          // the decoder doesn't know about these vertices until the split
          // symbol is decoded at which point two vertices are merged into one.
          // This can be most likely solved on the encoder side by splitting the
          // tip vertex into two, but since split symbols are relatively rare,
          // it's probably not worth doing it.
          vertex_valences_[corner_table_->Vertex(last_corner_).value()] = -1;
          ++num_split_symbols_;
        }
        break;
      case TOPOLOGY_R:
        // Compute prediction.
        predicted_symbol = ComputePredictedSymbol(corner_table_->Vertex(next));
        // Update valences.
        vertex_valences_[corner_table_->Vertex(last_corner_).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(next).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 2;
        break;
      case TOPOLOGY_L:
        vertex_valences_[corner_table_->Vertex(last_corner_).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(next).value()] -= 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_table_->Vertex(last_corner_).value()] -= 2;
        vertex_valences_[corner_table_->Vertex(next).value()] -= 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 2;
        break;
      default:
        break;
    }
    // Flag used when it's necessary to explicitly store the previous symbol.
    bool store_prev_symbol = true;
    if (predicted_symbol != -1) {
      if (predicted_symbol == prev_symbol_) {
        predictions_.push_back(true);
        store_prev_symbol = false;
      } else if (prev_symbol_ != -1) {
        predictions_.push_back(false);
      }
    }
    if (store_prev_symbol && prev_symbol_ != -1) {
      MeshEdgebreakerTraversalEncoder::EncodeSymbol(
          static_cast<EdgebreakerTopologyBitPattern>(prev_symbol_));
    }
    prev_symbol_ = symbol;
  }